

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O3

HT_TimelineListenerContainer * ht_timeline_listener_container_create(void)

{
  HT_TimelineListenerContainer *ptr;
  HT_TimelineListenerEntry *pHVar1;
  HT_Mutex *pHVar2;
  
  ptr = (HT_TimelineListenerContainer *)ht_alloc(0x30);
  if (ptr != (HT_TimelineListenerContainer *)0x0) {
    pHVar1 = (HT_TimelineListenerEntry *)ht_alloc(0x180);
    (ptr->entries).data = pHVar1;
    if (pHVar1 != (HT_TimelineListenerEntry *)0x0) {
      (ptr->entries).min_capacity = 0x10;
      (ptr->entries).capacity = 0x10;
      (ptr->entries).size = 0;
      pHVar2 = ht_mutex_create();
      ptr->mutex = pHVar2;
      if (pHVar2 != (HT_Mutex *)0x0) {
        ptr->id = 0;
        ptr->refcount = 1;
        return ptr;
      }
      ht_free((ptr->entries).data);
      (ptr->entries).capacity = 0;
      (ptr->entries).size = 0;
      (ptr->entries).data = (HT_TimelineListenerEntry *)0x0;
    }
    ht_free(ptr);
  }
  return (HT_TimelineListenerContainer *)0x0;
}

Assistant:

HT_TimelineListenerContainer*
ht_timeline_listener_container_create(void)
{
    HT_TimelineListenerContainer* container = HT_CREATE_TYPE(HT_TimelineListenerContainer);

    if (container == NULL)
    {
        goto done;
    }

    if (ht_bag_listener_init(&container->entries, 16) != HT_ERR_OK)
    {
        goto error_init_entries;
    }

    container->mutex = ht_mutex_create();
    if (container->mutex == NULL)
    {
        goto error_create_mutex;
    }

    container->id = 0;
    container->refcount = 1;
    goto done;

error_create_mutex:
    ht_bag_listener_deinit(&container->entries);
error_init_entries:
    ht_free(container);
    container = NULL;
done:
    return container;
}